

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg
          (nordic_itch_handler *this,itch_order_book_directory *m)

{
  char *timestamp;
  size_type sVar1;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> this_01;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>,_bool>
  pVar2;
  order_book ob;
  size_t end;
  string sym;
  uint64_t order_book_id;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  pair<const_unsigned_long,_helix::order_book> *in_stack_fffffffffffffd50;
  key_type *in_stack_fffffffffffffd58;
  value_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd60;
  allocator *symbol;
  order_book *in_stack_fffffffffffffd90;
  string local_178 [256];
  string local_78 [32];
  long local_58;
  allocator local_39;
  string local_38 [32];
  uint64_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 1),6);
  timestamp = (char *)(local_10 + 7);
  symbol = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,timestamp,0x10,symbol);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = std::__cxx11::string::find_first_of((char *)local_38,0x156141);
  if (local_58 != -1) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)local_38);
    std::__cxx11::string::operator=(local_38,local_78);
    std::__cxx11::string::~string(local_78);
  }
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (sVar1 != 0) {
    std::__cxx11::string::string(local_178,local_38);
    nordic_itch_handler::timestamp(in_RDI);
    this_00 = (unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
               *)std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffd50,
                      (key_type *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    order_book::order_book
              (in_stack_fffffffffffffd90,(string *)symbol,(uint64_t)timestamp,(size_t)in_RDI);
    std::__cxx11::string::~string(local_178);
    __x = (value_type *)&in_RDI->order_book_id_map;
    std::pair<const_unsigned_long,_helix::order_book>::
    pair<unsigned_long_&,_helix::order_book,_true>
              (in_stack_fffffffffffffd50,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               (order_book *)0x14ea24);
    pVar2 = std::
            unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
            ::insert(this_00,__x);
    this_01._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>._M_cur;
    std::pair<const_unsigned_long,_helix::order_book>::~pair
              ((pair<const_unsigned_long,_helix::order_book> *)0x14ea5c);
    order_book::~order_book((order_book *)this_01._M_cur);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_book_directory* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));

    std::string sym{m->Symbol, ITCH_SYMBOL_LEN};
    std::size_t end = sym.find_first_of(" ");
    if (end != std::string::npos) {
        sym = sym.substr(0, end);
    }
    if (_symbols.count(sym) > 0) {
        order_book ob{sym, timestamp(), _symbol_max_orders.at(sym)};
        order_book_id_map.insert({order_book_id, std::move(ob)});
    }
}